

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O0

void player_safe_name(char *safe,size_t safelen,char *name,_Bool strip_suffix)

{
  char *pcVar1;
  ushort **ppuVar2;
  char *local_50;
  byte local_41;
  char c;
  char *suffix;
  size_t limit;
  size_t i;
  _Bool strip_suffix_local;
  char *name_local;
  size_t safelen_local;
  char *safe_local;
  
  suffix = (char *)0x0;
  if (name != (char *)0x0) {
    pcVar1 = find_roman_suffix_start(name);
    if (pcVar1 == (char *)0x0) {
      suffix = (char *)strlen(name);
    }
    else {
      suffix = pcVar1 + (-1 - (long)name);
    }
  }
  local_50 = (char *)safelen;
  if (suffix <= safelen) {
    local_50 = suffix;
  }
  for (limit = 0; limit < local_50; limit = limit + 1) {
    local_41 = name[limit];
    ppuVar2 = __ctype_b_loc();
    if ((((*ppuVar2)[(int)(uint)local_41] & 0x400) == 0) &&
       (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)local_41] & 0x800) == 0)) {
      local_41 = 0x5f;
    }
    safe[limit] = local_41;
  }
  safe[limit] = '\0';
  if (*safe == '\0') {
    my_strcpy(safe,"PLAYER",safelen);
  }
  return;
}

Assistant:

void player_safe_name(char *safe, size_t safelen, const char *name, bool strip_suffix)
{
	size_t i;
	size_t limit = 0;

	if (name) {
		char *suffix = find_roman_suffix_start(name);

		if (suffix) {
			limit = suffix - name - 1; /* -1 for preceding space */
		} else {
			limit = strlen(name);
		}
	}

	/* Limit to maximum size of safename buffer */
	limit = MIN(limit, safelen);

	for (i = 0; i < limit; i++) {
		char c = name[i];

		/* Convert all non-alphanumeric symbols */
		if (!isalpha((unsigned char)c) && !isdigit((unsigned char)c))
			c = '_';

		/* Build "base_name" */
		safe[i] = c;
	}

	/* Terminate */
	safe[i] = '\0';

	/* Require a "base" name */
	if (!safe[0])
		my_strcpy(safe, "PLAYER", safelen);
}